

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O1

ssize_t __thiscall DomColor::read(DomColor *this,int __fd,void *__buf,size_t __nbytes)

{
  char cVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  undefined4 in_register_00000034;
  QString *pQVar5;
  long lVar6;
  long in_FS_OFFSET;
  QStringView QVar7;
  QStringView QVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  QStringView QVar12;
  QStringView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_98;
  QString local_80;
  QStringView local_68;
  QArrayDataPointer<QXmlStreamAttribute> local_50;
  long local_38;
  
  pQVar5 = (QString *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  if (local_50.size != 0) {
    lVar6 = 0;
    do {
      local_68.m_data = *(storage_type_conflict **)(local_50.ptr + lVar6 + 8);
      local_68.m_size = *(qsizetype *)(local_50.ptr + lVar6 + 0x10);
      if ((local_68.m_size == 5) &&
         (QVar7.m_data = local_68.m_data, QVar7.m_size = 5, QVar12.m_data = L"alpha",
         QVar12.m_size = 5, cVar1 = QtPrivate::equalStrings(QVar7,QVar12), cVar1 != '\0')) {
        QVar8.m_data = *(storage_type_conflict **)(local_50.ptr + lVar6 + 0x50);
        QVar8.m_size = *(qsizetype *)(local_50.ptr + lVar6 + 0x58);
        lVar4 = QString::toIntegral_helper(QVar8,(bool *)0x0,10);
        iVar2 = (int)lVar4;
        if (iVar2 != lVar4) {
          iVar2 = 0;
        }
        this->m_attr_alpha = iVar2;
        this->m_has_attr_alpha = true;
      }
      else {
        local_98.a.m_size = 0x15;
        local_98.a.m_data = "Unexpected attribute ";
        local_98.b = &local_68;
        QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>(&local_80,&local_98);
        QXmlStreamReader::raiseError(pQVar5);
        if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      lVar6 = lVar6 + 0x68;
    } while (local_50.size * 0x68 - lVar6 != 0);
  }
  iVar2 = QXmlStreamReader::error();
  if (iVar2 == 0) {
    iVar2 = 0;
    do {
      iVar3 = QXmlStreamReader::readNext();
      if (iVar3 == 4) {
        local_68.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_68.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
        local_68 = (QStringView)QXmlStreamReader::name();
        QVar13.m_data = L"red";
        QVar13.m_size = 3;
        iVar3 = QtPrivate::compareStrings(local_68,QVar13,CaseInsensitive);
        if (iVar3 == 0) {
          QXmlStreamReader::readElementText(&local_80,pQVar5,0);
          QVar9.m_data = local_80.d.ptr;
          QVar9.m_size = local_80.d.size;
          lVar6 = QString::toIntegral_helper(QVar9,(bool *)0x0,10);
          iVar3 = (int)lVar6;
          if ((int)lVar6 != lVar6) {
            iVar3 = iVar2;
          }
          *(byte *)&this->m_children = (byte)this->m_children | 1;
          this->m_red = iVar3;
        }
        else {
          QVar14.m_data = L"green";
          QVar14.m_size = 5;
          iVar3 = QtPrivate::compareStrings(local_68,QVar14,CaseInsensitive);
          if (iVar3 == 0) {
            QXmlStreamReader::readElementText(&local_80,pQVar5,0);
            QVar10.m_data = local_80.d.ptr;
            QVar10.m_size = local_80.d.size;
            lVar6 = QString::toIntegral_helper(QVar10,(bool *)0x0,10);
            iVar3 = (int)lVar6;
            if ((int)lVar6 != lVar6) {
              iVar3 = iVar2;
            }
            *(byte *)&this->m_children = (byte)this->m_children | 2;
            this->m_green = iVar3;
          }
          else {
            QVar15.m_data = L"blue";
            QVar15.m_size = 4;
            iVar3 = QtPrivate::compareStrings(local_68,QVar15,CaseInsensitive);
            if (iVar3 == 0) {
              QXmlStreamReader::readElementText(&local_80,pQVar5,0);
              QVar11.m_data = local_80.d.ptr;
              QVar11.m_size = local_80.d.size;
              lVar6 = QString::toIntegral_helper(QVar11,(bool *)0x0,10);
              iVar3 = (int)lVar6;
              if ((int)lVar6 != lVar6) {
                iVar3 = iVar2;
              }
              *(byte *)&this->m_children = (byte)this->m_children | 4;
              this->m_blue = iVar3;
            }
            else {
              local_98.a.m_size = 0x13;
              local_98.a.m_data = "Unexpected element ";
              local_98.b = &local_68;
              QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                        (&local_80,&local_98);
              QXmlStreamReader::raiseError(pQVar5);
            }
          }
        }
        if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      else if (iVar3 == 5) break;
      iVar3 = QXmlStreamReader::error();
    } while (iVar3 == 0);
  }
  QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomColor::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"alpha"_s) {
            setAttributeAlpha(attribute.value().toInt());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"red"_s, Qt::CaseInsensitive)) {
                setElementRed(reader.readElementText().toInt());
                continue;
            }
            if (!tag.compare(u"green"_s, Qt::CaseInsensitive)) {
                setElementGreen(reader.readElementText().toInt());
                continue;
            }
            if (!tag.compare(u"blue"_s, Qt::CaseInsensitive)) {
                setElementBlue(reader.readElementText().toInt());
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}